

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

bool createdir(char *path)

{
  int iVar1;
  size_t len;
  
  len = strlen(path);
  if (path[len - 1] == '/') {
    path = copystring(createdir::strip,path,len);
  }
  iVar1 = mkdir(path,0x1ff);
  return iVar1 == 0;
}

Assistant:

bool createdir(const char *path)
{
    size_t len = strlen(path);
    if(path[len-1]==PATHDIV)
    {
        static string strip;
        path = copystring(strip, path, len);
    }
#ifdef WIN32
    return CreateDirectory(path, NULL)!=0;
#else
    return mkdir(path, 0777)==0;
#endif
}